

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O2

void __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/global_object.cpp:407:53)>
::move(impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_global_object_cpp:407:53)>
       *this,model *to)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  
  to->_vptr_model = (_func_int **)&PTR_destroy_001c61b0;
  to[2]._vptr_model = (_func_int **)0x0;
  peVar1 = (this->f).timers.
           super___shared_ptr<std::unordered_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  p_Var2 = (this->f).timers.
           super___shared_ptr<std::unordered_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (this->f).timers.
  super___shared_ptr<std::unordered_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  to[1]._vptr_model = (_func_int **)peVar1;
  to[2]._vptr_model = (_func_int **)p_Var2;
  (this->f).timers.
  super___shared_ptr<std::unordered_map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::hash<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::equal_to<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  to[3]._vptr_model = (_func_int **)(this->f).h;
  return;
}

Assistant:

explicit impl(F&& f) : f(std::move(f)) {}